

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_hmac_sha256(void)

{
  ptls_hash_algorithm_t *algo;
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_size_t *p_Var1;
  int iVar2;
  ptls_cipher_suite_t *ppVar3;
  size_t sVar4;
  ptls_hash_context_t *ppVar5;
  ptls_hash_context_t *hctx;
  uint8_t digest [32];
  char *expected;
  char *message;
  char *secret;
  
  ppVar3 = find_cipher(ctx,0x1301);
  algo = ppVar3->hash;
  sVar4 = strlen("\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v");
  ppVar5 = ptls_hmac_create(algo,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",sVar4);
  memset(&hctx,0,0x20);
  p_Var1 = ppVar5->update;
  sVar4 = strlen("Hi There");
  (*p_Var1)(ppVar5,"Hi There",sVar4);
  (*ppVar5->final)(ppVar5,&hctx,PTLS_HASH_FINAL_MODE_RESET);
  iVar2 = memcmp(&hctx,anon_var_dwarf_b925,0x20);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5f);
  memset(&hctx,0,0x20);
  p_Var1 = ppVar5->update;
  sVar4 = strlen("Hi There");
  (*p_Var1)(ppVar5,"Hi There",sVar4);
  (*ppVar5->final)(ppVar5,&hctx,PTLS_HASH_FINAL_MODE_RESET);
  iVar2 = memcmp(&hctx,anon_var_dwarf_b925,0x20);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",100);
  memset(&hctx,0,0x20);
  p_Var1 = ppVar5->update;
  sVar4 = strlen("Hi There");
  (*p_Var1)(ppVar5,"Hi There",sVar4);
  (*ppVar5->final)(ppVar5,&hctx,PTLS_HASH_FINAL_MODE_FREE);
  iVar2 = memcmp(&hctx,anon_var_dwarf_b925,0x20);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x69);
  return;
}

Assistant:

static void test_hmac_sha256(void)
{
    /* test vector from RFC 4231 */
    const char *secret = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", *message = "Hi There",
               *expected =
                   "\xb0\x34\x4c\x61\xd8\xdb\x38\x53\x5c\xa8\xaf\xce\xaf\x0b\xf1\x2b\x88\x1d\xc2\x00\xc9\x83\x3d\xa7\x26\xe9\x37"
                   "\x6c\x2e\x32\xcf\xf7";
    uint8_t digest[32];

    ptls_hash_context_t *hctx =
        ptls_hmac_create(find_cipher(ctx, PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)->hash, secret, strlen(secret));

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_RESET);
    ok(memcmp(digest, expected, 32) == 0);

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_RESET);
    ok(memcmp(digest, expected, 32) == 0);

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_FREE);
    ok(memcmp(digest, expected, 32) == 0);
}